

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_ngeom(REF_NODE ref_node,REF_GEOM ref_geom,REF_INT type,REF_INT *ngeom)

{
  REF_MPI ref_mpi;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  REF_INT ngeom_local;
  
  ref_mpi = ref_node->ref_mpi;
  ngeom_local = 0;
  uVar2 = 0;
  uVar3 = (ulong)(uint)ref_geom->max;
  if (ref_geom->max < 1) {
    uVar3 = uVar2;
  }
  iVar5 = 0;
  for (; uVar3 * 0x18 - uVar2 != 0; uVar2 = uVar2 + 0x18) {
    if ((*(int *)((long)ref_geom->descr + uVar2) == type) &&
       (ref_mpi->id == ref_node->part[*(int *)((long)ref_geom->descr + uVar2 + 0x14)])) {
      iVar5 = iVar5 + 1;
      ngeom_local = iVar5;
    }
  }
  uVar1 = ref_mpi_sum(ref_mpi,&ngeom_local,ngeom,1,1);
  if (uVar1 == 0) {
    uVar1 = ref_mpi_bcast(ref_mpi,ngeom,1,1);
    if (uVar1 == 0) {
      return 0;
    }
    pcVar6 = "bcast";
    uVar4 = 0xcfb;
  }
  else {
    pcVar6 = "sum";
    uVar4 = 0xcfa;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar4,
         "ref_gather_ngeom",(ulong)uVar1,pcVar6);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_gather_ngeom(REF_NODE ref_node, REF_GEOM ref_geom,
                                    REF_INT type, REF_INT *ngeom) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT geom, node;
  REF_INT ngeom_local;

  ngeom_local = 0;
  each_ref_geom_of(ref_geom, type, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, node)) ngeom_local++;
  }

  RSS(ref_mpi_sum(ref_mpi, &ngeom_local, ngeom, 1, REF_INT_TYPE), "sum");
  RSS(ref_mpi_bcast(ref_mpi, ngeom, 1, REF_INT_TYPE), "bcast");

  return REF_SUCCESS;
}